

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O0

DistanceEntry * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetDistanceEntryForLoop
          (LoopDependenceAnalysis *this,Loop *loop,DistanceVector *distance_vector)

{
  size_type sVar1;
  reference ppLVar2;
  vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_> *this_00;
  ulong local_38;
  size_t loop_index;
  DistanceEntry *distance_entry;
  DistanceVector *distance_vector_local;
  Loop *loop_local;
  LoopDependenceAnalysis *this_local;
  
  if (loop == (Loop *)0x0) {
    this_local = (LoopDependenceAnalysis *)0x0;
  }
  else {
    loop_index = 0;
    local_38 = 0;
    while( true ) {
      sVar1 = std::vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
              ::size(&this->loops_);
      if (sVar1 <= local_38) break;
      ppLVar2 = std::
                vector<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>::
                operator[](&this->loops_,local_38);
      if (loop == *ppLVar2) {
        this_00 = DistanceVector::GetEntries(distance_vector);
        loop_index = (size_t)std::
                             vector<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                             ::operator[](this_00,local_38);
        break;
      }
      local_38 = local_38 + 1;
    }
    this_local = (LoopDependenceAnalysis *)loop_index;
  }
  return (DistanceEntry *)this_local;
}

Assistant:

DistanceEntry* LoopDependenceAnalysis::GetDistanceEntryForLoop(
    const Loop* loop, DistanceVector* distance_vector) {
  if (!loop) {
    return nullptr;
  }

  DistanceEntry* distance_entry = nullptr;
  for (size_t loop_index = 0; loop_index < loops_.size(); ++loop_index) {
    if (loop == loops_[loop_index]) {
      distance_entry = &(distance_vector->GetEntries()[loop_index]);
      break;
    }
  }

  return distance_entry;
}